

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O1

void twice_cb(uv_timer_t *handle)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  long lVar3;
  uv__queue *puVar4;
  uv_loop_t *puVar5;
  long *plVar6;
  code **ppcVar7;
  uv_timer_t *puVar8;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_368 [120];
  uv_loop_t *puStack_2f0;
  code *pcStack_2e8;
  void *pvStack_2e0;
  undefined1 auStack_2d8 [16];
  undefined8 uStack_2c8;
  uv__queue *puStack_2c0;
  undefined1 auStack_2b8 [24];
  uv_close_cb p_Stack_2a0;
  uv__queue *puStack_298;
  undefined8 uStack_288;
  undefined1 auStack_280 [176];
  code *pcStack_1d0;
  long lStack_1c8;
  long lStack_1c0;
  undefined1 auStack_1b8 [8];
  uv_loop_t *apuStack_1b0 [15];
  uv_loop_t *apuStack_138 [15];
  uv_loop_t *puStack_c0;
  undefined1 auStack_98 [120];
  uv_timer_t *puStack_20;
  uv__queue *local_18;
  uv__queue *local_10;
  
  puStack_20 = (uv_timer_t *)0x1d645b;
  printf("TWICE_CB %d\n",(ulong)(uint)twice_cb_called);
  if (handle == (uv_timer_t *)0x0) {
    puStack_20 = (uv_timer_t *)0x1d64a1;
    twice_cb_cold_2();
  }
  else {
    puStack_20 = (uv_timer_t *)0x1d6468;
    iVar1 = uv_is_active(handle);
    local_10 = (uv__queue *)(long)iVar1;
    local_18 = (uv__queue *)0x0;
    if (local_10 == (uv__queue *)0x0) {
      twice_cb_called = twice_cb_called + 1;
      uv_close(handle,twice_close_cb);
      return;
    }
  }
  puStack_20 = (uv_timer_t *)run_test_timer_init;
  twice_cb_cold_1();
  puStack_20 = handle;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_98);
  if (iVar1 == 0) {
    lVar3 = uv_timer_get_repeat(auStack_98);
    if (lVar3 != 0) goto LAB_001d65cd;
    uv_timer_get_due_in(auStack_98);
    iVar1 = uv_is_active(auStack_98);
    if (iVar1 != 0) goto LAB_001d65eb;
    handle = (uv_timer_t *)uv_default_loop();
    uv_walk(handle,close_walk_cb,0);
    uv_run(handle,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_timer_init_cold_1();
LAB_001d65cd:
    run_test_timer_init_cold_2();
    run_test_timer_init_cold_5();
LAB_001d65eb:
    run_test_timer_init_cold_3();
  }
  run_test_timer_init_cold_4();
  plVar6 = &lStack_1c8;
  auStack_1b8._4_4_ = 0;
  auStack_1b8._0_4_ = 1;
  pcStack_1d0 = (code *)0x1d6628;
  puStack_c0 = (uv_loop_t *)handle;
  uVar2 = uv_default_loop();
  pcStack_1d0 = (code *)0x1d6638;
  iVar1 = uv_timer_init(uVar2,apuStack_138);
  apuStack_1b0[0] = (uv_loop_t *)(long)iVar1;
  lStack_1c8 = 0;
  if (apuStack_1b0[0] == (uv_loop_t *)0x0) {
    pcStack_1d0 = (code *)0x1d665b;
    uVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d6668;
    iVar1 = uv_timer_init(uVar2,apuStack_1b0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d68d8;
    handle = (uv_timer_t *)(auStack_1b8 + 4);
    pcStack_1d0 = (code *)0x1d66a6;
    apuStack_138[0] = (uv_loop_t *)handle;
    iVar1 = uv_timer_start(apuStack_138,order_cb_a,0,0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d68e5;
    pcStack_1d0 = (code *)0x1d66e1;
    apuStack_1b0[0] = (uv_loop_t *)auStack_1b8;
    iVar1 = uv_timer_start(apuStack_1b0,order_cb_b,0,0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d68f2;
    pcStack_1d0 = (code *)0x1d6704;
    uVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d670e;
    iVar1 = uv_run(uVar2,0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d68ff;
    lStack_1c8 = 2;
    lStack_1c0 = (long)order_cb_called;
    if (lStack_1c0 != 2) goto LAB_001d690c;
    pcStack_1d0 = (code *)0x1d675c;
    iVar1 = uv_timer_stop(apuStack_138);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d6919;
    pcStack_1d0 = (code *)0x1d6784;
    iVar1 = uv_timer_stop(apuStack_1b0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d6926;
    order_cb_called = 0;
    pcStack_1d0 = (code *)0x1d67c4;
    apuStack_1b0[0] = (uv_loop_t *)handle;
    iVar1 = uv_timer_start(apuStack_1b0,order_cb_b,0,0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d6933;
    pcStack_1d0 = (code *)0x1d67fd;
    apuStack_138[0] = (uv_loop_t *)auStack_1b8;
    iVar1 = uv_timer_start(apuStack_138,order_cb_a,0,0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d6940;
    pcStack_1d0 = (code *)0x1d6820;
    uVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d682a;
    iVar1 = uv_run(uVar2,0);
    lStack_1c8 = (long)iVar1;
    lStack_1c0 = 0;
    if (lStack_1c8 != 0) goto LAB_001d694d;
    lStack_1c8 = 2;
    lStack_1c0 = (long)order_cb_called;
    if (lStack_1c0 != 2) goto LAB_001d695a;
    pcStack_1d0 = (code *)0x1d6870;
    handle = (uv_timer_t *)uv_default_loop();
    pcStack_1d0 = (code *)0x1d6884;
    uv_walk(handle,close_walk_cb,0);
    pcStack_1d0 = (code *)0x1d688e;
    uv_run(handle,0);
    lStack_1c8 = 0;
    pcStack_1d0 = (code *)0x1d689b;
    uVar2 = uv_default_loop();
    pcStack_1d0 = (code *)0x1d68a3;
    iVar1 = uv_loop_close(uVar2);
    lStack_1c0 = (long)iVar1;
    if (lStack_1c8 == lStack_1c0) {
      pcStack_1d0 = (code *)0x1d68be;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_1d0 = (code *)0x1d68d8;
    run_test_timer_order_cold_1();
LAB_001d68d8:
    pcStack_1d0 = (code *)0x1d68e5;
    run_test_timer_order_cold_2();
LAB_001d68e5:
    pcStack_1d0 = (code *)0x1d68f2;
    run_test_timer_order_cold_3();
LAB_001d68f2:
    pcStack_1d0 = (code *)0x1d68ff;
    run_test_timer_order_cold_4();
LAB_001d68ff:
    pcStack_1d0 = (code *)0x1d690c;
    run_test_timer_order_cold_5();
LAB_001d690c:
    pcStack_1d0 = (code *)0x1d6919;
    run_test_timer_order_cold_6();
LAB_001d6919:
    pcStack_1d0 = (code *)0x1d6926;
    run_test_timer_order_cold_7();
LAB_001d6926:
    pcStack_1d0 = (code *)0x1d6933;
    run_test_timer_order_cold_8();
LAB_001d6933:
    pcStack_1d0 = (code *)0x1d6940;
    run_test_timer_order_cold_9();
LAB_001d6940:
    pcStack_1d0 = (code *)0x1d694d;
    run_test_timer_order_cold_10();
LAB_001d694d:
    pcStack_1d0 = (code *)0x1d695a;
    run_test_timer_order_cold_11();
LAB_001d695a:
    pcStack_1d0 = (code *)0x1d6967;
    run_test_timer_order_cold_12();
  }
  pcStack_1d0 = order_cb_a;
  run_test_timer_order_cold_13();
  pcStack_1d0 = (code *)(long)order_cb_called;
  order_cb_called = order_cb_called + 1;
  auStack_280._168_8_ = SEXT48(*(int *)*plVar6);
  if (pcStack_1d0 == (code *)auStack_280._168_8_) {
    return;
  }
  ppcVar7 = &pcStack_1d0;
  auStack_280._152_8_ = order_cb_b;
  order_cb_a_cold_1();
  auStack_280._152_8_ = SEXT48(order_cb_called);
  order_cb_called = order_cb_called + 1;
  auStack_280._144_8_ = SEXT48(*(int *)*ppcVar7);
  if (auStack_280._152_8_ == auStack_280._144_8_) {
    return;
  }
  auStack_280._128_8_ = run_test_timer_zero_timeout;
  order_cb_b_cold_1();
  puStack_298 = (uv__queue *)0x1d6a09;
  auStack_280._128_8_ = handle;
  puVar4 = (uv__queue *)uv_default_loop();
  puStack_298 = (uv__queue *)0x1d6a19;
  iVar1 = uv_timer_init(puVar4,auStack_280 + 8);
  auStack_280._0_8_ = SEXT48(iVar1);
  uStack_288 = (uv_handle_t *)0x0;
  if ((uv_handle_t *)auStack_280._0_8_ == (uv_handle_t *)0x0) {
    puStack_298 = (uv__queue *)0x1d6a4e;
    iVar1 = uv_timer_start(auStack_280 + 8,zero_timeout_cb,0,0);
    auStack_280._0_8_ = SEXT48(iVar1);
    uStack_288 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_280._0_8_ != (uv_handle_t *)0x0) goto LAB_001d6b76;
    auStack_280._0_8_ = (uv_handle_t *)0x1;
    puStack_298 = (uv__queue *)0x1d6a81;
    iVar1 = uv_run(puVar4,0);
    uStack_288 = SEXT48(iVar1);
    if (auStack_280._0_8_ != uStack_288) goto LAB_001d6b85;
    auStack_280._0_8_ = (uv_handle_t *)0x1;
    uStack_288 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_288 != (uv_handle_t *)0x1) goto LAB_001d6b94;
    puStack_298 = (uv__queue *)0x1d6ac9;
    uv_close(auStack_280 + 8,0);
    puStack_298 = (uv__queue *)0x1d6ad3;
    iVar1 = uv_run(puVar4,0);
    auStack_280._0_8_ = SEXT48(iVar1);
    uStack_288 = (uv_handle_t *)0x0;
    if ((uv_handle_t *)auStack_280._0_8_ != (uv_handle_t *)0x0) goto LAB_001d6ba3;
    auStack_280._0_8_ = (uv_handle_t *)0x1;
    uStack_288 = SEXT48(zero_timeout_cb_calls);
    if ((uv_handle_t *)uStack_288 != (uv_handle_t *)0x1) goto LAB_001d6bb2;
    puStack_298 = (uv__queue *)0x1d6b29;
    uv_walk(puVar4,close_walk_cb,0);
    puStack_298 = (uv__queue *)0x1d6b33;
    uv_run(puVar4,0);
    auStack_280._0_8_ = (uv_handle_t *)0x0;
    puStack_298 = (uv__queue *)0x1d6b44;
    iVar1 = uv_loop_close(puVar4);
    uStack_288 = SEXT48(iVar1);
    if (auStack_280._0_8_ == uStack_288) {
      puStack_298 = (uv__queue *)0x1d6b5c;
      uv_library_shutdown();
      return;
    }
  }
  else {
    puStack_298 = (uv__queue *)0x1d6b76;
    run_test_timer_zero_timeout_cold_1();
LAB_001d6b76:
    puStack_298 = (uv__queue *)0x1d6b85;
    run_test_timer_zero_timeout_cold_2();
LAB_001d6b85:
    puStack_298 = (uv__queue *)0x1d6b94;
    run_test_timer_zero_timeout_cold_3();
LAB_001d6b94:
    puStack_298 = (uv__queue *)0x1d6ba3;
    run_test_timer_zero_timeout_cold_4();
LAB_001d6ba3:
    puStack_298 = (uv__queue *)0x1d6bb2;
    run_test_timer_zero_timeout_cold_5();
LAB_001d6bb2:
    puStack_298 = (uv__queue *)0x1d6bc1;
    run_test_timer_zero_timeout_cold_6();
  }
  puVar5 = (uv_loop_t *)auStack_280;
  puStack_298 = (uv__queue *)zero_timeout_cb;
  run_test_timer_zero_timeout_cold_7();
  auStack_2b8._8_8_ = (uv_loop_t *)0x1d6be8;
  puStack_298 = puVar4;
  iVar1 = uv_timer_start();
  p_Stack_2a0 = (uv_close_cb)(long)iVar1;
  auStack_2b8._16_8_ = (uv_handle_t *)0x0;
  if (p_Stack_2a0 == (uv_close_cb)0x0) {
    auStack_2b8._8_8_ = (uv_loop_t *)0x1d6c0b;
    uv_stop(*(undefined8 *)&puVar5->active_handles);
    zero_timeout_cb_calls = zero_timeout_cb_calls + 1;
    return;
  }
  auStack_2b8._8_8_ = run_test_timer_huge_timeout;
  zero_timeout_cb_cold_1();
  uStack_2c8._0_4_ = 0x1d6c2e;
  uStack_2c8._4_4_ = 0;
  auStack_2b8._8_8_ = puVar5;
  uVar2 = uv_default_loop();
  uStack_2c8._0_4_ = 0x1d6c3d;
  uStack_2c8._4_4_ = 0;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_2b8._0_8_ = SEXT48(iVar1);
  puStack_2c0 = (uv__queue *)0x0;
  if ((uv__queue *)auStack_2b8._0_8_ == (uv__queue *)0x0) {
    uStack_2c8._0_4_ = 0x1d6c60;
    uStack_2c8._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d6c6f;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d6e7a;
    uStack_2c8._0_4_ = 0x1d6c92;
    uStack_2c8._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d6ca1;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_init(uVar2,&huge_timer2);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d6e87;
    uStack_2c8._0_4_ = 0x1d6cd9;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d6e94;
    puVar5 = (uv_loop_t *)0xffffffffffff;
    uStack_2c8._0_4_ = 0x1d6d19;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d6ea1;
    uStack_2c8._0_4_ = 0x1d6d53;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d6eae;
    auStack_2b8._0_8_ = (uv__queue *)0x1;
    uStack_2c8._0_4_ = 0x1d6d86;
    uStack_2c8._4_4_ = 0;
    puStack_2c0 = (uv__queue *)uv_timer_get_due_in(&tiny_timer);
    if ((uv__queue *)auStack_2b8._0_8_ != puStack_2c0) goto LAB_001d6ebb;
    auStack_2b8._0_8_ = (uv__queue *)0xffffffffffff;
    uStack_2c8._0_4_ = 0x1d6daa;
    uStack_2c8._4_4_ = 0;
    puStack_2c0 = (uv__queue *)uv_timer_get_due_in(&huge_timer1);
    if ((uv__queue *)auStack_2b8._0_8_ != puStack_2c0) goto LAB_001d6ec8;
    auStack_2b8._0_8_ = (uv__queue *)0x0;
    uStack_2c8._0_4_ = 0x1d6dd2;
    uStack_2c8._4_4_ = 0;
    puStack_2c0 = (uv__queue *)uv_timer_get_due_in(&huge_timer2);
    if (puStack_2c0 < (ulong)auStack_2b8._0_8_) goto LAB_001d6ed5;
    uStack_2c8._0_4_ = 0x1d6dea;
    uStack_2c8._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d6df4;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_run(uVar2,0);
    auStack_2b8._0_8_ = SEXT48(iVar1);
    puStack_2c0 = (uv__queue *)0x0;
    if ((uv__queue *)auStack_2b8._0_8_ != (uv__queue *)0x0) goto LAB_001d6ee2;
    uStack_2c8._0_4_ = 0x1d6e17;
    uStack_2c8._4_4_ = 0;
    puVar5 = (uv_loop_t *)uv_default_loop();
    uStack_2c8._0_4_ = 0x1d6e2b;
    uStack_2c8._4_4_ = 0;
    uv_walk(puVar5,close_walk_cb,0);
    uStack_2c8._0_4_ = 0x1d6e35;
    uStack_2c8._4_4_ = 0;
    uv_run(puVar5,0);
    auStack_2b8._0_8_ = (uv__queue *)0x0;
    uStack_2c8._0_4_ = 0x1d6e43;
    uStack_2c8._4_4_ = 0;
    uVar2 = uv_default_loop();
    uStack_2c8._0_4_ = 0x1d6e4b;
    uStack_2c8._4_4_ = 0;
    iVar1 = uv_loop_close(uVar2);
    puStack_2c0 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)auStack_2b8._0_8_ == puStack_2c0) {
      uStack_2c8._0_4_ = 0x1d6e65;
      uStack_2c8._4_4_ = 0;
      uv_library_shutdown();
      return;
    }
  }
  else {
    uStack_2c8._0_4_ = 0x1d6e7a;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_1();
LAB_001d6e7a:
    uStack_2c8._0_4_ = 0x1d6e87;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_2();
LAB_001d6e87:
    uStack_2c8._0_4_ = 0x1d6e94;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_3();
LAB_001d6e94:
    uStack_2c8._0_4_ = 0x1d6ea1;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_4();
LAB_001d6ea1:
    uStack_2c8._0_4_ = 0x1d6eae;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_5();
LAB_001d6eae:
    uStack_2c8._0_4_ = 0x1d6ebb;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_6();
LAB_001d6ebb:
    uStack_2c8._0_4_ = 0x1d6ec8;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_7();
LAB_001d6ec8:
    uStack_2c8._0_4_ = 0x1d6ed5;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_8();
LAB_001d6ed5:
    uStack_2c8._0_4_ = 0x1d6ee2;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_11();
LAB_001d6ee2:
    uStack_2c8._0_4_ = 0x1d6eef;
    uStack_2c8._4_4_ = 0;
    run_test_timer_huge_timeout_cold_9();
  }
  puVar8 = (uv_timer_t *)auStack_2b8;
  uStack_2c8 = tiny_timer_cb;
  run_test_timer_huge_timeout_cold_10();
  if (puVar8 == &tiny_timer) {
    auStack_2d8._8_8_ = (uv_loop_t *)0x1d6f17;
    uv_close(&tiny_timer,0);
    auStack_2d8._8_8_ = (uv_loop_t *)0x1d6f25;
    uv_close(&huge_timer1,0);
    uv_close(&huge_timer2,0);
    return;
  }
  auStack_2d8._8_8_ = run_test_timer_huge_repeat;
  tiny_timer_cb_cold_1();
  pcStack_2e8 = (code *)0x1d6f43;
  auStack_2d8._8_8_ = puVar5;
  uVar2 = uv_default_loop();
  pcStack_2e8 = (code *)0x1d6f52;
  iVar1 = uv_timer_init(uVar2,&tiny_timer);
  auStack_2d8._0_8_ = SEXT48(iVar1);
  pvStack_2e0 = (void *)0x0;
  if ((void *)auStack_2d8._0_8_ == (void *)0x0) {
    pcStack_2e8 = (code *)0x1d6f75;
    uVar2 = uv_default_loop();
    pcStack_2e8 = (code *)0x1d6f84;
    iVar1 = uv_timer_init(uVar2,&huge_timer1);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d70ab;
    pcStack_2e8 = (code *)0x1d6fbf;
    iVar1 = uv_timer_start(&tiny_timer,huge_repeat_cb,2,2);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d70b8;
    pcStack_2e8 = (code *)0x1d6ffc;
    iVar1 = uv_timer_start(&huge_timer1,huge_repeat_cb,1,0xffffffffffffffff);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d70c5;
    pcStack_2e8 = (code *)0x1d701f;
    uVar2 = uv_default_loop();
    pcStack_2e8 = (code *)0x1d7029;
    iVar1 = uv_run(uVar2,0);
    auStack_2d8._0_8_ = SEXT48(iVar1);
    pvStack_2e0 = (void *)0x0;
    if ((void *)auStack_2d8._0_8_ != (void *)0x0) goto LAB_001d70d2;
    pcStack_2e8 = (code *)0x1d704c;
    puVar5 = (uv_loop_t *)uv_default_loop();
    pcStack_2e8 = (code *)0x1d7060;
    uv_walk(puVar5,close_walk_cb,0);
    pcStack_2e8 = (code *)0x1d706a;
    uv_run(puVar5,0);
    auStack_2d8._0_8_ = (void *)0x0;
    pcStack_2e8 = (code *)0x1d7078;
    uVar2 = uv_default_loop();
    pcStack_2e8 = (code *)0x1d7080;
    iVar1 = uv_loop_close(uVar2);
    pvStack_2e0 = (void *)(long)iVar1;
    if ((void *)auStack_2d8._0_8_ == pvStack_2e0) {
      pcStack_2e8 = (code *)0x1d7096;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_2e8 = (code *)0x1d70ab;
    run_test_timer_huge_repeat_cold_1();
LAB_001d70ab:
    pcStack_2e8 = (code *)0x1d70b8;
    run_test_timer_huge_repeat_cold_2();
LAB_001d70b8:
    pcStack_2e8 = (code *)0x1d70c5;
    run_test_timer_huge_repeat_cold_3();
LAB_001d70c5:
    pcStack_2e8 = (code *)0x1d70d2;
    run_test_timer_huge_repeat_cold_4();
LAB_001d70d2:
    pcStack_2e8 = (code *)0x1d70df;
    run_test_timer_huge_repeat_cold_5();
  }
  puVar8 = (uv_timer_t *)auStack_2d8;
  pcStack_2e8 = huge_repeat_cb;
  run_test_timer_huge_repeat_cold_6();
  iVar1 = huge_repeat_cb::ncalls;
  if (huge_repeat_cb::ncalls != 0) {
    if (puVar8 == &tiny_timer) goto LAB_001d7114;
    puStack_2f0 = (uv_loop_t *)0x1d7108;
    huge_repeat_cb_cold_1();
    iVar1 = extraout_EAX;
  }
  if (puVar8 == &huge_timer1) {
LAB_001d7114:
    huge_repeat_cb::ncalls = iVar1 + 1;
    if (huge_repeat_cb::ncalls != 10) {
      return;
    }
    puStack_2f0 = (uv_loop_t *)0x1d712f;
    uv_close(&tiny_timer,0);
    uv_close(&huge_timer1,0);
    return;
  }
  puStack_2f0 = (uv_loop_t *)run_test_timer_run_once;
  huge_repeat_cb_cold_2();
  puStack_2f0 = puVar5;
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,auStack_368);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(auStack_368,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_001d7345;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d7354;
    if (timer_run_once_timer_cb_called != 1) goto LAB_001d7363;
    iVar1 = uv_timer_start(auStack_368,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_001d7372;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_001d7381;
    if (timer_run_once_timer_cb_called != 2) goto LAB_001d7390;
    uv_close(auStack_368,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001d73ae;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_001d7345:
    run_test_timer_run_once_cold_2();
LAB_001d7354:
    run_test_timer_run_once_cold_3();
LAB_001d7363:
    run_test_timer_run_once_cold_4();
LAB_001d7372:
    run_test_timer_run_once_cold_5();
LAB_001d7381:
    run_test_timer_run_once_cold_6();
LAB_001d7390:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_001d73ae:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return;
}

Assistant:

static void twice_cb(uv_timer_t* handle) {
  printf("TWICE_CB %d\n", twice_cb_called);

  ASSERT_NOT_NULL(handle);
  ASSERT_OK(uv_is_active((uv_handle_t*) handle));

  twice_cb_called++;

  uv_close((uv_handle_t*)handle, twice_close_cb);
}